

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O2

bool __thiscall
ODDLParser::OpenDDLExport::writeNodeHeader(OpenDDLExport *this,DDLNode *node,string *statement)

{
  string *psVar1;
  
  if (node != (DDLNode *)0x0) {
    DDLNode::getType_abi_cxx11_(node);
    std::__cxx11::string::append((string *)statement);
    psVar1 = DDLNode::getName_abi_cxx11_(node);
    if (psVar1->_M_string_length != 0) {
      std::__cxx11::string::append((char *)statement);
      std::__cxx11::string::append((char *)statement);
      std::__cxx11::string::append((string *)statement);
    }
  }
  return node != (DDLNode *)0x0;
}

Assistant:

bool OpenDDLExport::writeNodeHeader( DDLNode *node, std::string &statement ) {
    if (ddl_nullptr == node) {
        return false;
    }

    statement += node->getType();
    const std::string &name( node->getName() );
    if ( !name.empty() ) {
        statement += " ";
        statement += "$";
        statement += name;
    }

    return true;
}